

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O2

int Abc_ObjChangeEval(Abc_Obj_t *pObj,Vec_Int_t *vInfo,Vec_Int_t *vFirst,int InvArea,int *pfUseInv)

{
  uint uVar1;
  void **ppvVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  int local_50;
  
  iVar3 = Mio_GateReadCell((Mio_Gate_t *)(pObj->field_5).pData);
  iVar3 = Vec_IntEntry(vFirst,iVar3);
  piVar5 = Vec_IntEntryP(vInfo,iVar3);
  uVar1 = (pObj->vFanins).nSize;
  iVar3 = Abc_NodeIsInv(pObj);
  if ((int)uVar1 < 1) {
    __assert_fail("iFanin > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                  ,0xe2,"int Abc_ObjChangeEval(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, int *)");
  }
  *pfUseInv = 0;
  if (piVar5[(ulong)uVar1 * 3] == -1) {
LAB_004411c2:
    local_50 = 0;
  }
  else {
    local_50 = InvArea;
    if (iVar3 == 0) {
      local_50 = piVar5[(ulong)uVar1 * 3 + 2];
    }
    iVar6 = 0;
    for (lVar7 = 0; lVar7 < (pObj->vFanouts).nSize; lVar7 = lVar7 + 1) {
      ppvVar2 = pObj->pNtk->vObjs->pArray;
      pNode = (Abc_Obj_t *)ppvVar2[(pObj->vFanouts).pArray[lVar7]];
      if ((iVar3 != 0) &&
         (iVar4 = Abc_NodeFindFanin(pNode,(Abc_Obj_t *)ppvVar2[*(pObj->vFanins).pArray]), -1 < iVar4
         )) goto LAB_004411c2;
      iVar4 = Abc_ObjHasDupFanins(pNode);
      if (iVar4 != 0) {
        return 0;
      }
      if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && (iVar4 = Abc_NodeIsBuf(pNode), iVar4 == 0))
      {
        iVar4 = Abc_NodeIsInv(pNode);
        if (iVar4 == 0) {
          iVar4 = Mio_GateReadCell((Mio_Gate_t *)(pNode->field_5).pData);
          iVar4 = Vec_IntEntry(vFirst,iVar4);
          piVar5 = Vec_IntEntryP(vInfo,iVar4);
          iVar4 = Abc_NodeFindFanin(pNode,pObj);
          if (piVar5[iVar4 * 3] == -1) goto LAB_00441147;
          local_50 = local_50 + piVar5[(long)(iVar4 * 3) + 2];
        }
        else {
          iVar4 = Abc_NodeCheckFanoutHasFanin(pNode,pObj);
          if (-1 < iVar4) {
            return 0;
          }
          local_50 = local_50 + InvArea;
        }
      }
      else {
LAB_00441147:
        iVar6 = 1;
      }
    }
    if (iVar6 == 0) {
      InvArea = 0;
    }
    local_50 = local_50 - InvArea;
    *pfUseInv = iVar6;
  }
  return local_50;
}

Assistant:

int Abc_ObjChangeEval( Abc_Obj_t * pObj, Vec_Int_t * vInfo, Vec_Int_t * vFirst, int InvArea, int * pfUseInv )
{
    Abc_Obj_t * pNext;
    //Mio_Gate_t * pGate = (Mio_Gate_t *)pObj->pData;
    int iFanCell, iNodeCell = Mio_GateReadCell( (Mio_Gate_t *)pObj->pData );
    int * pFanInfo, * pNodeInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iNodeCell) );
    int i, fNeedInv = 0, Gain = 0, iFanin = Abc_ObjFaninNum(pObj), fUseInv = Abc_NodeIsInv(pObj);
    assert( iFanin > 0 );
    *pfUseInv = 0;
    if ( pNodeInfo[3*iFanin] == -1 )
        return 0;
    if ( fUseInv )
        Gain = InvArea;
    else
        Gain = pNodeInfo[3*iFanin+2];
    Abc_ObjForEachFanout( pObj, pNext, i )
    {
        if ( fUseInv && Abc_NodeFindFanin(pNext, Abc_ObjFanin0(pObj)) >= 0 )
            return 0;
        if ( Abc_ObjHasDupFanins(pNext) )
            return 0;
        if ( !Abc_ObjIsNode(pNext) || Abc_NodeIsBuf(pNext) )
        {
            fNeedInv = 1;
            continue;
        }
        if ( Abc_NodeIsInv(pNext) )
        {
            if ( Abc_NodeCheckFanoutHasFanin(pNext, pObj) >= 0 )
                return 0;
            Gain += InvArea;
            continue;
        }
        iFanCell = Mio_GateReadCell( (Mio_Gate_t *)pNext->pData );
        pFanInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iFanCell) );
        iFanin   = Abc_NodeFindFanin( pNext, pObj );
        if ( pFanInfo[3*iFanin] == -1 )
        {
            fNeedInv = 1;
            continue;
        }
        Gain += pFanInfo[3*iFanin+2];
    }
    if ( fNeedInv )
        Gain -= InvArea;
    *pfUseInv = fNeedInv;
    return Gain;
}